

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

bool __thiscall QHttpNetworkConnectionChannel::ensureConnection(QHttpNetworkConnectionChannel *this)

{
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QAnyStringView newValue;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  SocketState SVar5;
  ProxyType PVar6;
  ConnectionType CVar7;
  QFlags<QIODeviceBase::OpenModeFlag> QVar8;
  ulong uVar9;
  QAuthenticatorPrivate *pQVar10;
  QHttpNetworkConnectionPrivate *pQVar11;
  QHttpNetworkReply *pQVar12;
  QAbstractSocket *pQVar13;
  QSslSocket *pQVar14;
  QLocalSocket *pQVar15;
  QAbstractSocket *pQVar16;
  EVP_PKEY_CTX *in_RSI;
  QHttpNetworkConnectionChannel *in_RDI;
  long in_FS_OFFSET;
  QAbstractSocket *s_2;
  QLocalSocket *s_1;
  QAbstractSocket *s;
  QSslSocket *sslSocket;
  QAbstractSocket *abSocket;
  QHttpNetworkReply *potentialReply;
  quint16 connectPort;
  QAuthenticatorPrivate *priv;
  SocketState socketState;
  shared_ptr<QSslContext> ctx;
  QHttpHeaders h;
  QNetworkProxy proxy;
  QByteArray value;
  QString connectHost;
  undefined4 in_stack_fffffffffffffd88;
  OpenModeFlag in_stack_fffffffffffffd8c;
  enum_type in_stack_fffffffffffffd90;
  enum_type in_stack_fffffffffffffd94;
  QHttpNetworkConnectionPrivate *in_stack_fffffffffffffd98;
  NetworkLayerProtocol in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  quint16 in_stack_fffffffffffffda6;
  QObject *in_stack_fffffffffffffda8;
  QSslSocket *in_stack_fffffffffffffdb0;
  qsizetype in_stack_fffffffffffffdc0;
  storage_type *in_stack_fffffffffffffdc8;
  undefined5 in_stack_fffffffffffffdf0;
  byte bVar17;
  byte bVar18;
  undefined8 in_stack_fffffffffffffe18;
  QFlagsStorage<QIODeviceBase::OpenModeFlag> QVar19;
  quint16 local_1b2;
  bool local_191;
  undefined4 local_190;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_140;
  undefined8 local_138;
  QUrl local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  QVar19.i = (Int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI[0x19] & 1) == 0) {
    init(in_RDI,in_RSI);
  }
  SVar5 = QSocketAbstraction::socketState
                    ((QIODevice *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if ((SVar5 == ClosingState) ||
     ((SVar5 != UnconnectedState && (uVar9 = QIODevice::isOpen(), (uVar9 & 1) == 0)))) {
    if (*(long *)(in_RDI + 0x38) != 0) {
      in_RDI[0x50] = (QHttpNetworkConnectionChannel)0x1;
    }
    local_191 = false;
    goto LAB_002fa35d;
  }
  if ((SVar5 == HostLookupState) || (SVar5 == ConnectingState)) {
    local_191 = false;
    goto LAB_002fa35d;
  }
  if (SVar5 == ConnectedState) {
    if (((byte)in_RDI[0x58] & 1) == 0) {
      local_191 = true;
    }
    else {
      local_191 = false;
    }
    goto LAB_002fa35d;
  }
  *(undefined4 *)(in_RDI + 0x20) = 1;
  in_RDI[0x58] = (QHttpNetworkConnectionChannel)((byte)in_RDI[0x18] & 1);
  *(undefined4 *)(in_RDI + 0xb0) = 0;
  in_RDI[0x70] = (QHttpNetworkConnectionChannel)0x0;
  in_RDI[0x71] = (QHttpNetworkConnectionChannel)0x0;
  QAuthenticator::detach
            ((QAuthenticator *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  pQVar10 = QAuthenticatorPrivate::getPrivate((QAuthenticator *)(in_RDI + 0x60));
  pQVar10->hasFailed = false;
  QAuthenticator::detach
            ((QAuthenticator *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  pQVar10 = QAuthenticatorPrivate::getPrivate((QAuthenticator *)(in_RDI + 0x68));
  pQVar10->hasFailed = false;
  pQVar10 = QAuthenticatorPrivate::getPrivate((QAuthenticator *)(in_RDI + 0x60));
  if ((pQVar10 != (QAuthenticatorPrivate *)0x0) && (pQVar10->phase == Done)) {
    pQVar10->phase = Start;
  }
  pQVar10 = QAuthenticatorPrivate::getPrivate((QAuthenticator *)(in_RDI + 0x68));
  if ((pQVar10 != (QAuthenticatorPrivate *)0x0) && (pQVar10->phase == Done)) {
    pQVar10->phase = Start;
  }
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f993a);
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9942);
  QString::QString((QString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f996a);
  pQVar11 = QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9972);
  local_1b2 = pQVar11->port;
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9992);
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f999a);
  pQVar12 = QHttpNetworkConnectionPrivate::predictNextRequestsReply
                      ((QHttpNetworkConnectionPrivate *)
                       CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  if (pQVar12 == (QHttpNetworkReply *)0x0) {
    bVar4 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                      ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                       CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    if (!bVar4) {
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::first
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      QMetaObject::invokeMethod<>
                (in_stack_fffffffffffffda8,
                 (char *)CONCAT26(in_stack_fffffffffffffda6,
                                  CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                 (ConnectionType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    }
  }
  else {
    QMetaObject::invokeMethod<>
              (in_stack_fffffffffffffda8,
               (char *)CONCAT26(in_stack_fffffffffffffda6,
                                CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
               (ConnectionType)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  }
  QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9a1e);
  QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9a26);
  PVar6 = QNetworkProxy::type((QNetworkProxy *)
                              CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  if ((PVar6 != NoProxy) && (((byte)in_RDI[0x18] & 1) == 0)) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9a5e);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9a66);
    QNetworkProxy::hostName((QNetworkProxy *)in_stack_fffffffffffffd98);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    QString::~QString((QString *)0x2f9a9f);
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9ab0);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9ab8);
    local_1b2 = QNetworkProxy::port((QNetworkProxy *)
                                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
  }
  pQVar13 = qobject_cast<QAbstractSocket*>((QObject *)0x2f9add);
  bVar17 = 0;
  bVar18 = bVar17;
  if (pQVar13 != (QAbstractSocket *)0x0) {
    QAbstractSocket::proxy((QAbstractSocket *)in_stack_fffffffffffffd98);
    PVar6 = QNetworkProxy::type((QNetworkProxy *)
                                CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    bVar17 = PVar6 == HttpProxy;
    bVar18 = bVar17;
    QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x2f9b56);
  }
  if ((bVar17 & 1) != 0) {
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)0x2f9b9d);
    QHttpNetworkRequest::url((QHttpNetworkRequest *)in_stack_fffffffffffffd98);
    bVar3 = QUrl::isEmpty();
    QUrl::~QUrl(&local_60);
    if ((bVar3 & 1) == 0) {
      QByteArrayView::QByteArrayView<11ul>
                ((QByteArrayView *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                 (char (*) [11])in_stack_fffffffffffffd98);
      QByteArray::QByteArray((QByteArray *)0x2f9db3);
      name_01.m_data = in_stack_fffffffffffffdc8;
      name_01.m_size = in_stack_fffffffffffffdc0;
      QHttpNetworkRequest::headerField
                ((QHttpNetworkRequest *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),name_01,
                 (QByteArray *)in_stack_fffffffffffffd98);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QByteArray::~QByteArray((QByteArray *)0x2f9dff);
      QByteArray::~QByteArray((QByteArray *)0x2f9e0c);
    }
    else {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9bef);
      CVar7 = QHttpNetworkConnection::connectionType
                        ((QHttpNetworkConnection *)
                         CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      if (CVar7 != ConnectionTypeHTTP2Direct) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9c0d);
        CVar7 = QHttpNetworkConnection::connectionType
                          ((QHttpNetworkConnection *)
                           CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        if ((CVar7 != ConnectionTypeHTTP2) ||
           (bVar4 = QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>
                                *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90)),
           bVar4)) {
          QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9cdd)
          ;
          QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9ce5);
          QHttpNetworkConnectionPrivate::predictNextRequest(in_stack_fffffffffffffd98);
          QByteArrayView::QByteArrayView<11ul>
                    ((QByteArrayView *)
                     CONCAT26(in_stack_fffffffffffffda6,
                              CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                     (char (*) [11])in_stack_fffffffffffffd98);
          QByteArray::QByteArray((QByteArray *)0x2f9d16);
          name_00.m_data = in_stack_fffffffffffffdc8;
          name_00.m_size = in_stack_fffffffffffffdc0;
          QHttpNetworkRequest::headerField
                    ((QHttpNetworkRequest *)
                     CONCAT26(in_stack_fffffffffffffda6,
                              CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),name_00
                     ,(QByteArray *)in_stack_fffffffffffffd98);
          QByteArray::operator=
                    ((QByteArray *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (QByteArray *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
          QByteArray::~QByteArray((QByteArray *)0x2f9d65);
          QByteArray::~QByteArray((QByteArray *)0x2f9d72);
          QHttpNetworkRequest::~QHttpNetworkRequest
                    ((QHttpNetworkRequest *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          goto LAB_002f9e0c;
        }
      }
      QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::first
                ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      QByteArrayView::QByteArrayView<11ul>
                ((QByteArrayView *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                 (char (*) [11])in_stack_fffffffffffffd98);
      QByteArray::QByteArray((QByteArray *)0x2f9c6e);
      name.m_data = in_stack_fffffffffffffdc8;
      name.m_size = in_stack_fffffffffffffdc0;
      QHttpNetworkRequest::headerField
                ((QHttpNetworkRequest *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),name,
                 (QByteArray *)in_stack_fffffffffffffd98);
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QByteArray::~QByteArray((QByteArray *)0x2f9cba);
      QByteArray::~QByteArray((QByteArray *)0x2f9cc7);
    }
LAB_002f9e0c:
    bVar4 = QByteArray::isEmpty((QByteArray *)0x2f9e19);
    if (!bVar4) {
      local_138 = 0xaaaaaaaaaaaaaaaa;
      QAbstractSocket::proxy((QAbstractSocket *)in_stack_fffffffffffffd98);
      local_140 = 0xaaaaaaaaaaaaaaaa;
      QNetworkProxy::headers((QNetworkProxy *)in_stack_fffffffffffffd98);
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)),
                 (QByteArray *)in_stack_fffffffffffffd98);
      newValue.field_0._5_1_ = bVar3;
      newValue.field_0._0_5_ = in_stack_fffffffffffffdf0;
      newValue.field_0._6_1_ = bVar17;
      newValue.field_0._7_1_ = bVar18;
      newValue.m_size = (size_t)in_RDI;
      QHttpHeaders::replaceOrAppend
                ((QHttpHeaders *)in_stack_fffffffffffffd98,in_stack_fffffffffffffd94,newValue);
      QNetworkProxy::setHeaders
                ((QNetworkProxy *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (QHttpHeaders *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QAbstractSocket::setProxy
                ((QAbstractSocket *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (QNetworkProxy *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x2f9ed7);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x2f9ee4);
    }
    QByteArray::~QByteArray((QByteArray *)0x2f9ef1);
  }
  if (((byte)in_RDI[0x18] & 1) == 0) {
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa0a9);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2fa0b1);
    PVar6 = QNetworkProxy::type((QNetworkProxy *)
                                CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    bVar2 = false;
    bVar1 = false;
    bVar4 = false;
    if (PVar6 == NoProxy) {
      QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa0f2);
      QHttpNetworkConnection::cacheProxy((QHttpNetworkConnection *)in_stack_fffffffffffffd98);
      bVar2 = true;
      PVar6 = QNetworkProxy::type((QNetworkProxy *)
                                  CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      bVar4 = false;
      if (PVar6 == NoProxy) {
        QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2fa135);
        QHttpNetworkConnection::transparentProxy
                  ((QHttpNetworkConnection *)in_stack_fffffffffffffd98);
        bVar1 = true;
        PVar6 = QNetworkProxy::type((QNetworkProxy *)
                                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
        bVar4 = PVar6 == NoProxy;
      }
    }
    QVar19.i = (Int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    if (bVar1) {
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x2fa185);
    }
    if (bVar2) {
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x2fa19e);
    }
    if (bVar4) {
      pQVar13 = qobject_cast<QAbstractSocket*>((QObject *)0x2fa1b9);
      if (pQVar13 == (QAbstractSocket *)0x0) {
        pQVar15 = qobject_cast<QLocalSocket*>((QObject *)0x2fa255);
        if (pQVar15 != (QLocalSocket *)0x0) {
          QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                    ((QFlags<QIODeviceBase::OpenModeFlag> *)
                     CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     in_stack_fffffffffffffd8c);
          QLocalSocket::connectToServer
                    ((QLocalSocket *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                     (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (OpenMode)QVar19.i);
        }
      }
      else {
        pQVar16 = pQVar13;
        QVar8 = ::operator|(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90);
        (**(code **)(*(long *)pQVar13 + 0xf8))
                  (pQVar13,&local_20,local_1b2,
                   QVar8.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                   super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,*(undefined4 *)(in_RDI + 0xe8)
                  );
        (**(code **)(*(long *)pQVar16 + 0x108))(pQVar16,0x400);
      }
    }
    else {
      pQVar16 = qobject_cast<QAbstractSocket*>((QObject *)0x2fa2b5);
      pQVar13 = pQVar16;
      QFlags<QIODeviceBase::OpenModeFlag>::QFlags
                ((QFlags<QIODeviceBase::OpenModeFlag> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 in_stack_fffffffffffffd8c);
      (**(code **)(*(long *)pQVar13 + 0xf8))
                (pQVar13,&local_20,local_1b2,local_190,*(undefined4 *)(in_RDI + 0xe8));
      (**(code **)(*(long *)pQVar16 + 0x108))(pQVar16,0x10000);
    }
  }
  else {
    pQVar14 = qobject_cast<QSslSocket*>((QObject *)0x2f9f0e);
    local_160 = 0xaaaaaaaaaaaaaaaa;
    local_158 = 0xaaaaaaaaaaaaaaaa;
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9f45);
    QHttpNetworkConnection::sslContext((QHttpNetworkConnection *)in_stack_fffffffffffffd98);
    bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_160);
    if (bVar4) {
      std::shared_ptr<QSslContext>::shared_ptr
                ((shared_ptr<QSslContext> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (shared_ptr<QSslContext> *)
                 CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      QSslSocketPrivate::checkSettingSslContext
                ((QSslSocket *)in_stack_fffffffffffffda8,
                 (shared_ptr<QSslContext> *)
                 CONCAT26(in_stack_fffffffffffffda6,
                          CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0)));
      std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x2f9fa9);
    }
    std::shared_ptr<QSslContext>::~shared_ptr((shared_ptr<QSslContext> *)0x2f9fb6);
    QPointer<QHttpNetworkConnection>::operator->((QPointer<QHttpNetworkConnection> *)0x2f9fd4);
    QHttpNetworkConnection::d_func((QHttpNetworkConnection *)0x2f9fdc);
    QSslSocket::setPeerVerifyName
              ((QSslSocket *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (QString *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)
               CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffd8c);
    QSslSocket::connectToHostEncrypted
              (in_stack_fffffffffffffdb0,(QString *)in_stack_fffffffffffffda8,
               in_stack_fffffffffffffda6,(OpenMode)QVar19.i,in_stack_fffffffffffffda0);
    if (((byte)in_RDI[0x89] & 1) != 0) {
      QSslSocket::ignoreSslErrors
                ((QSslSocket *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
    }
    QSslSocket::ignoreSslErrors
              ((QSslSocket *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (QList<QSslError> *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    (**(code **)(*(long *)&(pQVar14->super_QTcpSocket).super_QAbstractSocket + 0x108))
              (pQVar14,0x10000);
  }
  local_191 = false;
  QString::~QString((QString *)0x2fa33e);
LAB_002fa35d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_191;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpNetworkConnectionChannel::ensureConnection()
{
    if (!isInitialized)
        init();

    QAbstractSocket::SocketState socketState = QSocketAbstraction::socketState(socket);

    // resend this request after we receive the disconnected signal
    // If !socket->isOpen() then we have already called close() on the socket, but there was still a
    // pending connectToHost() for which we hadn't seen a connected() signal, yet. The connected()
    // has now arrived (as indicated by socketState != ClosingState), but we cannot send anything on
    // such a socket anymore.
    if (socketState == QAbstractSocket::ClosingState ||
            (socketState != QAbstractSocket::UnconnectedState && !socket->isOpen())) {
        if (reply)
            resendCurrent = true;
        return false;
    }

    // already trying to connect?
    if (socketState == QAbstractSocket::HostLookupState ||
        socketState == QAbstractSocket::ConnectingState) {
        return false;
    }

    // make sure that this socket is in a connected state, if not initiate
    // connection to the host.
    if (socketState != QAbstractSocket::ConnectedState) {
        // connect to the host if not already connected.
        state = QHttpNetworkConnectionChannel::ConnectingState;
        pendingEncrypt = ssl;

        // reset state
        pipeliningSupported = PipeliningSupportUnknown;
        authenticationCredentialsSent = false;
        proxyCredentialsSent = false;
        authenticator.detach();
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(authenticator);
        priv->hasFailed = false;
        proxyAuthenticator.detach();
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        priv->hasFailed = false;

        // This workaround is needed since we use QAuthenticator for NTLM authentication. The "phase == Done"
        // is the usual criteria for emitting authentication signals. The "phase" is set to "Done" when the
        // last header for Authorization is generated by the QAuthenticator. Basic & Digest logic does not
        // check the "phase" for generating the Authorization header. NTLM authentication is a two stage
        // process & needs the "phase". To make sure the QAuthenticator uses the current username/password
        // the phase is reset to Start.
        priv = QAuthenticatorPrivate::getPrivate(authenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;

        QString connectHost = connection->d_func()->hostName;
        quint16 connectPort = connection->d_func()->port;

        QHttpNetworkReply *potentialReply = connection->d_func()->predictNextRequestsReply();
        if (potentialReply) {
            QMetaObject::invokeMethod(potentialReply, "socketStartedConnecting", Qt::QueuedConnection);
        } else if (!h2RequestsToSend.isEmpty()) {
            QMetaObject::invokeMethod(std::as_const(h2RequestsToSend).first().second, "socketStartedConnecting", Qt::QueuedConnection);
        }

#ifndef QT_NO_NETWORKPROXY
        // HTTPS always use transparent proxy.
        if (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy && !ssl) {
            connectHost = connection->d_func()->networkProxy.hostName();
            connectPort = connection->d_func()->networkProxy.port();
        }
        if (auto *abSocket = qobject_cast<QAbstractSocket *>(socket);
            abSocket && abSocket->proxy().type() == QNetworkProxy::HttpProxy) {
            // Make user-agent field available to HTTP proxy socket engine (QTBUG-17223)
            QByteArray value;
            // ensureConnection is called before any request has been assigned, but can also be
            // called again if reconnecting
            if (request.url().isEmpty()) {
                if (connection->connectionType()
                            == QHttpNetworkConnection::ConnectionTypeHTTP2Direct
                    || (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
                        && !h2RequestsToSend.isEmpty())) {
                    value = std::as_const(h2RequestsToSend).first().first.headerField("user-agent");
                } else {
                    value = connection->d_func()->predictNextRequest().headerField("user-agent");
                }
            } else {
                value = request.headerField("user-agent");
            }
            if (!value.isEmpty()) {
                QNetworkProxy proxy(abSocket->proxy());
                auto h = proxy.headers();
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::UserAgent, value);
                proxy.setHeaders(std::move(h));
                abSocket->setProxy(proxy);
            }
        }
#endif
        if (ssl) {
#ifndef QT_NO_SSL
            QSslSocket *sslSocket = qobject_cast<QSslSocket*>(socket);

            // check whether we can re-use an existing SSL session
            // (meaning another socket in this connection has already
            // performed a full handshake)
            if (auto ctx = connection->sslContext())
                QSslSocketPrivate::checkSettingSslContext(sslSocket, std::move(ctx));

            sslSocket->setPeerVerifyName(connection->d_func()->peerVerifyName);
            sslSocket->connectToHostEncrypted(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
            if (ignoreAllSslErrors)
                sslSocket->ignoreSslErrors();
            sslSocket->ignoreSslErrors(ignoreSslErrorsList);

            // limit the socket read buffer size. we will read everything into
            // the QHttpNetworkReply anyway, so let's grow only that and not
            // here and there.
            sslSocket->setReadBufferSize(64*1024);
#else
            // Need to dequeue the request so that we can emit the error.
            if (!reply)
                connection->d_func()->dequeueRequest(socket);
            connection->d_func()->emitReplyError(socket, reply, QNetworkReply::ProtocolUnknownError);
#endif
        } else {
            // In case of no proxy we can use the Unbuffered QTcpSocket
#ifndef QT_NO_NETWORKPROXY
            if (connection->d_func()->networkProxy.type() == QNetworkProxy::NoProxy
                    && connection->cacheProxy().type() == QNetworkProxy::NoProxy
                    && connection->transparentProxy().type() == QNetworkProxy::NoProxy) {
#endif
                if (auto *s = qobject_cast<QAbstractSocket *>(socket)) {
                    s->connectToHost(connectHost, connectPort,
                                     QIODevice::ReadWrite | QIODevice::Unbuffered,
                                     networkLayerPreference);
                    // For an Unbuffered QTcpSocket, the read buffer size has a special meaning.
                    s->setReadBufferSize(1 * 1024);
#if QT_CONFIG(localserver)
                } else if (auto *s = qobject_cast<QLocalSocket *>(socket)) {
                    s->connectToServer(connectHost);
#endif
                }
#ifndef QT_NO_NETWORKPROXY
            } else {
                auto *s = qobject_cast<QAbstractSocket *>(socket);
                Q_ASSERT(s);
                // limit the socket read buffer size. we will read everything into
                // the QHttpNetworkReply anyway, so let's grow only that and not
                // here and there.
                s->connectToHost(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
                s->setReadBufferSize(64 * 1024);
            }
#endif
        }
        return false;
    }

    // This code path for ConnectedState
    if (pendingEncrypt) {
        // Let's only be really connected when we have received the encrypted() signal. Else the state machine seems to mess up
        // and corrupt the things sent to the server.
        return false;
    }

    return true;
}